

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_object.cpp
# Opt level: O2

void graphics_repaint(Am_Slot first_invalidated)

{
  bool bVar1;
  Am_Value *in_value;
  Am_State_Store *this;
  Am_Value value;
  Am_Object self;
  Am_Slot first_invalidated_local;
  
  Am_Slot::Get_Owner((Am_Slot *)&value);
  Am_Object::Am_Object(&self,(Am_Object *)&value);
  Am_Object::~Am_Object((Am_Object *)&value);
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(&self,0x7d8,1);
  Am_Value::operator=(&value,in_value);
  bVar1 = Am_Value::Exists(&value);
  if (bVar1) {
    this = (Am_State_Store *)Am_Value::operator_cast_to_void_(&value);
    if (this != (Am_State_Store *)0x0) {
      Am_State_Store::Add(this,false);
    }
  }
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&self);
  return;
}

Assistant:

void
graphics_repaint(Am_Slot first_invalidated)
{
  Am_Object self = first_invalidated.Get_Owner();
  Am_Value value;
  value = self.Peek(Am_PREV_STATE);
  if (!value.Exists())
    return;
  Am_State_Store *state = Am_State_Store::Narrow(value);
  if (state)
    state->Add(false);
}